

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

bool __thiscall
HighsDomain::ConflictSet::explainInfeasibilityLeq
          (ConflictSet *this,HighsInt *inds,double *vals,HighsInt len,double rhs,double minAct)

{
  pointer *ppRVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  HighsDomain *pHVar3;
  pointer ppVar4;
  pointer pdVar5;
  iterator __position;
  bool bVar6;
  long lVar7;
  int iVar8;
  NodeSetArray *pNVar9;
  pointer ppVar10;
  pointer pRVar11;
  int *piVar12;
  pointer pRVar13;
  ulong uVar14;
  HighsInt HVar15;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar16;
  double dVar17;
  HighsCDouble M;
  ResolveCandidate local_88;
  double local_68;
  vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
  *local_60;
  NodeSetArray *local_58;
  NodeSetArray *local_50;
  undefined1 local_48 [16];
  
  if (minAct <= -INFINITY) {
    return false;
  }
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = rhs;
  local_48._12_4_ = in_XMM0_Dd;
  HVar15 = 0x7fffffff;
  if (this->localdom->infeasible_ == true) {
    HVar15 = this->localdom->infeasible_pos;
  }
  local_60 = (vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
              *)&this->resolveBuffer;
  local_68 = minAct;
  std::
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ::reserve((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             *)local_60,(long)len);
  pRVar13 = (this->resolveBuffer).
            super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar11 = (this->resolveBuffer).
            super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar11 != pRVar13) {
    (this->resolveBuffer).
    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar13;
    pRVar11 = pRVar13;
  }
  if (0 < len) {
    _Var2._M_head_impl =
         (this->localdom->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    local_58 = (NodeSetArray *)((long)&(_Var2._M_head_impl)->nodequeue + 0x48);
    local_50 = (NodeSetArray *)((long)&(_Var2._M_head_impl)->nodequeue + 0x40);
    uVar14 = 0;
LAB_00299fd9:
    lVar7 = (long)inds[uVar14];
    local_88.valuePos = (HighsInt)uVar14;
    dVar17 = vals[uVar14];
    pHVar3 = this->localdom;
    ppVar4 = (pHVar3->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (dVar17 <= 0.0) {
      ppVar10 = (pointer)((pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar7);
      piVar12 = (pHVar3->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7;
      do {
        dVar16 = ppVar10->first;
        local_88.boundPos = *piVar12;
        if (local_88.boundPos <= HVar15) {
          if (local_88.boundPos == -1) goto LAB_0029a19a;
          if ((ppVar4[local_88.boundPos].first != dVar16) ||
             (NAN(ppVar4[local_88.boundPos].first) || NAN(dVar16))) goto LAB_0029a0e3;
        }
        ppVar10 = ppVar4 + local_88.boundPos;
        piVar12 = &ppVar4[local_88.boundPos].second;
      } while( true );
    }
    ppVar10 = (pointer)((pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar7);
    piVar12 = (pHVar3->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7;
    do {
      dVar16 = ppVar10->first;
      local_88.boundPos = *piVar12;
      if (local_88.boundPos <= HVar15) {
        if (local_88.boundPos == -1) goto LAB_0029a19a;
        if ((ppVar4[local_88.boundPos].first != dVar16) ||
           (NAN(ppVar4[local_88.boundPos].first) || NAN(dVar16))) goto LAB_0029a0a7;
      }
      ppVar10 = ppVar4 + local_88.boundPos;
      piVar12 = &ppVar4[local_88.boundPos].second;
    } while( true );
  }
LAB_0029a1b4:
  if (pRVar13 != pRVar11) {
    uVar14 = (long)pRVar11 - (long)pRVar13 >> 5;
    iVar8 = 0;
    if (1 < uVar14) {
      iVar8 = 0;
      do {
        uVar14 = (long)uVar14 >> 1;
        iVar8 = iVar8 + 1;
      } while (1 < uVar14);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>,std::less<HighsDomain::ConflictSet::ResolveCandidate>,false>
              (pRVar13,pRVar11,iVar8,1);
  }
  dVar17 = ABS((double)local_48._0_8_);
  if (dVar17 <= 10.0) {
    dVar17 = 10.0;
  }
  M.lo = 0.0;
  M.hi = local_68;
  bVar6 = resolveLinearLeq(this,M,dVar17 * ((this->localdom->mipsolver->mipdata_)._M_t.
                                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                           _M_head_impl)->feastol + (double)local_48._0_8_,vals);
  return bVar6;
LAB_0029a0e3:
  pdVar5 = (this->globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_88.baseBound = pdVar5[lVar7];
  if ((local_88.boundPos == -1) || (local_88.baseBound <= dVar16)) goto LAB_0029a19a;
  local_88.delta = dVar16 - local_88.baseBound;
  pNVar9 = local_58;
  goto LAB_0029a11d;
LAB_0029a0a7:
  pdVar5 = (this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_88.baseBound = pdVar5[lVar7];
  if ((local_88.boundPos == -1) || (dVar16 <= local_88.baseBound)) goto LAB_0029a19a;
  local_88.delta = dVar16 - local_88.baseBound;
  pNVar9 = local_50;
LAB_0029a11d:
  local_88.delta = local_88.delta * dVar17;
  local_88.prio =
       ABS((double)(*(long *)((long)pNVar9->_M_t + 0x30 + lVar7 * 0x38) + 1) *
           (dVar16 - pdVar5[lVar7]) * dVar17);
  __position._M_current =
       (this->resolveBuffer).
       super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
    ::_M_realloc_insert<HighsDomain::ConflictSet::ResolveCandidate_const&>
              (local_60,__position,&local_88);
  }
  else {
    (__position._M_current)->prio = local_88.prio;
    (__position._M_current)->boundPos = local_88.boundPos;
    (__position._M_current)->valuePos = local_88.valuePos;
    (__position._M_current)->delta = local_88.delta;
    (__position._M_current)->baseBound = local_88.baseBound;
    ppRVar1 = &(this->resolveBuffer).
               super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
LAB_0029a19a:
  uVar14 = uVar14 + 1;
  if (uVar14 == (uint)len) goto code_r0x0029a1a6;
  goto LAB_00299fd9;
code_r0x0029a1a6:
  pRVar13 = (this->resolveBuffer).
            super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar11 = (this->resolveBuffer).
            super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  goto LAB_0029a1b4;
}

Assistant:

bool HighsDomain::ConflictSet::explainInfeasibilityLeq(const HighsInt* inds,
                                                       const double* vals,
                                                       HighsInt len, double rhs,
                                                       double minAct) {
  if (minAct == -kHighsInf) return false;

  HighsInt infeasible_pos = kHighsIInf;
  if (localdom.infeasible_) infeasible_pos = localdom.infeasible_pos;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double lb = localdom.getColLowerPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_lower_[col];
      if (cand.baseBound >= lb || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    } else {
      double ub = localdom.getColUpperPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_upper_[col];
      if (cand.baseBound <= ub || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    }

    resolveBuffer.push_back(cand);
  }

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // compute the lower bound of M that is necessary
  double Mlower = rhs + std::max(10.0, std::fabs(rhs)) *
                            localdom.mipsolver->mipdata_->feastol;

  return resolveLinearLeq(minAct, Mlower, vals);
}